

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveFile::writeSymData(CDirectiveFile *this,SymbolData *symData)

{
  int iVar1;
  long lVar2;
  element_type *peVar3;
  
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 - 1U < 3) {
    peVar3 = (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar2 = 0x68;
LAB_00171830:
    (**(code **)((long)(peVar3->super_AssemblerFile)._vptr_AssemblerFile + lVar2))();
    return;
  }
  if (iVar1 == 4) {
    peVar3 = (element_type *)
             (this->closeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar2 = 0x70;
    if (peVar3 != (element_type *)0x0) goto LAB_00171830;
  }
  return;
}

Assistant:

void CDirectiveFile::writeSymData(SymbolData& symData) const
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		file->beginSymData(symData);
		break;
	case Type::Close:
		if (closeFile)
			closeFile->endSymData(symData);
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}
}